

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

void __thiscall FFlatVertexBuffer::CreateVBO(FFlatVertexBuffer *this)

{
  FFlatVertex *__dest;
  uint uVar1;
  FFlatVertex *__src;
  FFlatVertexBuffer *this_local;
  
  TArray<FFlatVertex,_FFlatVertex>::Resize(&this->vbo_shadowdata,this->mNumReserved);
  CreateFlatVBO(this);
  uVar1 = TArray<FFlatVertex,_FFlatVertex>::Size(&this->vbo_shadowdata);
  this->mIndex = uVar1;
  this->mCurIndex = uVar1;
  Map(this);
  __dest = this->map;
  __src = TArray<FFlatVertex,_FFlatVertex>::operator[](&this->vbo_shadowdata,0);
  uVar1 = TArray<FFlatVertex,_FFlatVertex>::Size(&this->vbo_shadowdata);
  memcpy(__dest,__src,(ulong)uVar1 * 0x14);
  Unmap(this);
  return;
}

Assistant:

void FFlatVertexBuffer::CreateVBO()
{
	vbo_shadowdata.Resize(mNumReserved);
	CreateFlatVBO();
	mCurIndex = mIndex = vbo_shadowdata.Size();
	Map();
	memcpy(map, &vbo_shadowdata[0], vbo_shadowdata.Size() * sizeof(FFlatVertex));
	Unmap();
}